

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void omp_display_affinity(char *format,size_t size)

{
  ConvertedString cformat;
  int gtid;
  char *in_stack_000001d8;
  int in_stack_000001e4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  kmp_info_t *in_stack_ffffffffffffffe0;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  __kmp_get_global_thread_id();
  ConvertedString::ConvertedString
            ((ConvertedString *)&in_stack_ffffffffffffffe0->th,in_stack_ffffffffffffffd8,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  ConvertedString::get((ConvertedString *)&stack0xffffffffffffffd8);
  __kmp_aux_display_affinity(in_stack_000001e4,in_stack_000001d8);
  ConvertedString::~ConvertedString((ConvertedString *)0x1cb206);
  return;
}

Assistant:

void FTN_STDCALL FTN_DISPLAY_AFFINITY(char const *format, size_t size) {
#ifdef KMP_STUB
  return;
#else
  int gtid;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  ConvertedString cformat(format, size);
  __kmp_aux_display_affinity(gtid, cformat.get());
#endif
}